

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_SerializationToStream_Test::TestBody
          (ExtensionSetTest_SerializationToStream_Test *this)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  char *in_R9;
  pointer *__ptr;
  string_view data_00;
  void *data_1;
  string data;
  ArrayOutputStream array_stream;
  CodedOutputStream output_stream;
  TestAllExtensions source;
  TestAllTypes destination;
  AssertHelper local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  AssertHelper local_450;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_448;
  string local_440;
  char *local_420;
  size_t local_418;
  char local_410;
  undefined7 uStack_40f;
  undefined1 local_400 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f8;
  undefined1 local_3e0 [48];
  ArrayOutputStream *local_3b0;
  undefined2 local_3a8;
  bool local_3a6;
  bool local_3a5;
  long *local_3a0;
  int64_t local_398;
  TestAllExtensions local_390;
  TestAllTypes local_360;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_390,(Arena *)0x0);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_360,(Arena *)0x0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>(&local_390);
  sVar4 = proto2_unittest::TestAllExtensions::ByteSizeLong(&local_390);
  local_418 = 0;
  local_410 = '\0';
  local_420 = &local_410;
  std::__cxx11::string::resize((ulong)&local_420,(char)sVar4);
  io::ArrayOutputStream::ArrayOutputStream((ArrayOutputStream *)local_400,local_420,(int)sVar4,1);
  local_3a6 = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  plVar1 = (long *)(local_3e0 + 0x10);
  local_3a8._0_1_ = false;
  local_3a8._1_1_ = false;
  local_3a5 = false;
  local_3e0._0_8_ = plVar1;
  local_3e0._8_8_ = plVar1;
  local_3b0 = (ArrayOutputStream *)local_400;
  local_3a0 = plVar1;
  local_398 = io::ArrayOutputStream::ByteCount((ArrayOutputStream *)local_400);
  bVar2 = io::ArrayOutputStream::Next
                    ((ArrayOutputStream *)local_400,(void **)&local_440,(int *)&local_460);
  if (bVar2 && 0 < (int)(uint)local_460.data_) {
    local_3a0 = (long *)local_440._M_dataplus._M_p;
    local_3e0._8_8_ = (long *)0x0;
    local_3e0._0_8_ = local_440._M_dataplus._M_p + -0x10;
    if ((uint)local_460.data_ < 0x11) {
      local_3a0 = plVar1;
      local_3e0._8_8_ = local_440._M_dataplus._M_p;
      local_3e0._0_8_ = plVar1;
    }
    local_3e0._0_8_ = local_3e0._0_8_ + (ulong)(uint)local_460.data_;
  }
  iVar3 = (*local_390.super_Message.super_MessageLite._vptr_MessageLite[5])
                    (&local_390,local_3a0,local_3e0);
  local_3a0 = (long *)CONCAT44(extraout_var,iVar3);
  bVar2 = io::CodedOutputStream::HadError((CodedOutputStream *)local_3e0);
  local_460.data_._0_4_ = CONCAT31(local_460.data_._1_3_,!bVar2);
  local_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_448);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,(internal *)&local_460,(AssertionResult *)"output_stream.HadError()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x236,local_440._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_450,(Message *)&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_448._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_448._M_head_impl + 8))();
    }
    if (local_458 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_458,local_458);
    }
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_3e0);
  }
  else {
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_3e0);
    data_00._M_str = local_420;
    data_00._M_len = local_418;
    local_400[0] = (internal)MessageLite::ParseFromString((MessageLite *)&local_360,data_00);
    local_3f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_400[0]) {
      testing::Message::Message((Message *)&local_440);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3e0,(internal *)local_400,
                 (AssertionResult *)"destination.ParseFromString(data)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_460,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x238,(char *)local_3e0._0_8_);
      testing::internal::AssertHelper::operator=(&local_460,(Message *)&local_440);
      testing::internal::AssertHelper::~AssertHelper(&local_460);
      if ((long *)local_3e0._0_8_ != plVar1) {
        operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
      }
      if ((long *)local_440._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_440._M_dataplus._M_p + 8))();
      }
      if (local_3f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3f8,local_3f8);
      }
    }
    TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(&local_360);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_360);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_390);
  return;
}

Assistant:

TEST(ExtensionSetTest, SerializationToStream) {
  // Serialize as TestAllExtensions and parse as TestAllTypes to insure wire
  // compatibility of extensions.
  //
  // This checks serialization to an output stream by creating an array output
  // stream that can only buffer 1 byte at a time - this prevents the message
  // from ever jumping to the fast path, ensuring that serialization happens via
  // the CodedOutputStream.
  unittest::TestAllExtensions source;
  unittest::TestAllTypes destination;
  TestUtil::SetAllExtensions(&source);
  size_t size = source.ByteSizeLong();
  std::string data;
  data.resize(size);
  {
    io::ArrayOutputStream array_stream(&data[0], size, 1);
    io::CodedOutputStream output_stream(&array_stream);
    source.SerializeWithCachedSizes(&output_stream);
    ASSERT_FALSE(output_stream.HadError());
  }
  EXPECT_TRUE(destination.ParseFromString(data));
  TestUtil::ExpectAllFieldsSet(destination);
}